

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceIntersector1MB>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 (*pauVar11) [16];
  byte bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  ulong uVar16;
  undefined4 uVar17;
  ulong unaff_RBP;
  undefined4 uVar18;
  ulong uVar19;
  byte bVar20;
  ulong uVar21;
  InstancePrimitive *prim;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  undefined1 (*local_1030) [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  undefined1 local_f78 [8];
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_f78 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar45 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    auVar24 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar45 = ZEXT1664(auVar24);
  }
  local_1030 = (undefined1 (*) [16])local_f68;
  uVar18 = *(undefined4 *)&(query->p).field_0;
  local_fa8._4_4_ = uVar18;
  local_fa8._0_4_ = uVar18;
  local_fa8._8_4_ = uVar18;
  local_fa8._12_4_ = uVar18;
  auVar43 = ZEXT1664(local_fa8);
  uVar18 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_fb8._4_4_ = uVar18;
  local_fb8._0_4_ = uVar18;
  local_fb8._8_4_ = uVar18;
  local_fb8._12_4_ = uVar18;
  auVar44 = ZEXT1664(local_fb8);
  uVar18 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fc8._4_4_ = uVar18;
  local_fc8._0_4_ = uVar18;
  local_fc8._8_4_ = uVar18;
  local_fc8._12_4_ = uVar18;
  auVar46 = ZEXT1664(local_fc8);
  uVar18 = *(undefined4 *)&(context->query_radius).field_0;
  auVar24._4_4_ = uVar18;
  auVar24._0_4_ = uVar18;
  auVar24._8_4_ = uVar18;
  auVar24._12_4_ = uVar18;
  uVar18 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar26._4_4_ = uVar18;
  auVar26._0_4_ = uVar18;
  auVar26._8_4_ = uVar18;
  auVar26._12_4_ = uVar18;
  uVar18 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar30._4_4_ = uVar18;
  auVar30._0_4_ = uVar18;
  auVar30._8_4_ = uVar18;
  auVar30._12_4_ = uVar18;
  bVar14 = false;
  do {
    local_fd8 = vsubps_avx(auVar43._0_16_,auVar24);
    fVar5 = auVar24._0_4_;
    fVar6 = auVar24._4_4_;
    fVar7 = auVar24._8_4_;
    fVar8 = auVar24._12_4_;
    local_fe8 = auVar43._0_4_ + fVar5;
    fStack_fe4 = auVar43._4_4_ + fVar6;
    fStack_fe0 = auVar43._8_4_ + fVar7;
    fStack_fdc = auVar43._12_4_ + fVar8;
    local_ff8 = vsubps_avx(auVar44._0_16_,auVar26);
    local_1008 = auVar44._0_4_ + auVar26._0_4_;
    fStack_1004 = auVar44._4_4_ + auVar26._4_4_;
    fStack_1000 = auVar44._8_4_ + auVar26._8_4_;
    fStack_ffc = auVar44._12_4_ + auVar26._12_4_;
    local_1018 = vsubps_avx(auVar46._0_16_,auVar30);
    local_1028._0_4_ = auVar46._0_4_ + auVar30._0_4_;
    local_1028._4_4_ = auVar46._4_4_ + auVar30._4_4_;
    local_1028._8_4_ = auVar46._8_4_ + auVar30._8_4_;
    local_1028._12_4_ = auVar46._12_4_ + auVar30._12_4_;
    local_f98._0_4_ = fVar5 * fVar5;
    local_f98._4_4_ = fVar6 * fVar6;
    local_f98._8_4_ = fVar7 * fVar7;
    local_f98._12_4_ = fVar8 * fVar8;
    auVar47 = ZEXT1664(local_f98);
    local_f88 = auVar45._0_16_;
    do {
      do {
        do {
          if (local_1030 == (undefined1 (*) [16])local_f78) {
            return bVar14;
          }
          pauVar11 = local_1030 + -1;
          local_1030 = local_1030 + -1;
        } while (auVar45._0_4_ < *(float *)(*pauVar11 + 8));
        uVar21 = *(ulong *)*local_1030;
        do {
          uVar18 = (undefined4)(unaff_RBP >> 0x20);
          auVar24 = auVar43._0_16_;
          auVar26 = auVar44._0_16_;
          auVar30 = auVar46._0_16_;
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar21 & 8) == 0) {
              uVar16 = uVar21 & 0xfffffffffffffff0;
              fVar5 = query->time;
              auVar23._4_4_ = fVar5;
              auVar23._0_4_ = fVar5;
              auVar23._8_4_ = fVar5;
              auVar23._12_4_ = fVar5;
              auVar27._0_4_ = fVar5 * *(float *)(uVar16 + 0x80) + *(float *)(uVar16 + 0x20);
              auVar27._4_4_ = fVar5 * *(float *)(uVar16 + 0x84) + *(float *)(uVar16 + 0x24);
              auVar27._8_4_ = fVar5 * *(float *)(uVar16 + 0x88) + *(float *)(uVar16 + 0x28);
              auVar27._12_4_ = fVar5 * *(float *)(uVar16 + 0x8c) + *(float *)(uVar16 + 0x2c);
              auVar31._0_4_ = fVar5 * *(float *)(uVar16 + 0xa0) + *(float *)(uVar16 + 0x40);
              auVar31._4_4_ = fVar5 * *(float *)(uVar16 + 0xa4) + *(float *)(uVar16 + 0x44);
              auVar31._8_4_ = fVar5 * *(float *)(uVar16 + 0xa8) + *(float *)(uVar16 + 0x48);
              auVar31._12_4_ = fVar5 * *(float *)(uVar16 + 0xac) + *(float *)(uVar16 + 0x4c);
              auVar34._0_4_ = fVar5 * *(float *)(uVar16 + 0xc0) + *(float *)(uVar16 + 0x60);
              auVar34._4_4_ = fVar5 * *(float *)(uVar16 + 0xc4) + *(float *)(uVar16 + 100);
              auVar34._8_4_ = fVar5 * *(float *)(uVar16 + 200) + *(float *)(uVar16 + 0x68);
              auVar34._12_4_ = fVar5 * *(float *)(uVar16 + 0xcc) + *(float *)(uVar16 + 0x6c);
              auVar36._0_4_ = fVar5 * *(float *)(uVar16 + 0x90) + *(float *)(uVar16 + 0x30);
              auVar36._4_4_ = fVar5 * *(float *)(uVar16 + 0x94) + *(float *)(uVar16 + 0x34);
              auVar36._8_4_ = fVar5 * *(float *)(uVar16 + 0x98) + *(float *)(uVar16 + 0x38);
              auVar36._12_4_ = fVar5 * *(float *)(uVar16 + 0x9c) + *(float *)(uVar16 + 0x3c);
              auVar39._0_4_ = fVar5 * *(float *)(uVar16 + 0xb0) + *(float *)(uVar16 + 0x50);
              auVar39._4_4_ = fVar5 * *(float *)(uVar16 + 0xb4) + *(float *)(uVar16 + 0x54);
              auVar39._8_4_ = fVar5 * *(float *)(uVar16 + 0xb8) + *(float *)(uVar16 + 0x58);
              auVar39._12_4_ = fVar5 * *(float *)(uVar16 + 0xbc) + *(float *)(uVar16 + 0x5c);
              auVar41._0_4_ = fVar5 * *(float *)(uVar16 + 0xd0) + *(float *)(uVar16 + 0x70);
              auVar41._4_4_ = fVar5 * *(float *)(uVar16 + 0xd4) + *(float *)(uVar16 + 0x74);
              auVar41._8_4_ = fVar5 * *(float *)(uVar16 + 0xd8) + *(float *)(uVar16 + 0x78);
              auVar41._12_4_ = fVar5 * *(float *)(uVar16 + 0xdc) + *(float *)(uVar16 + 0x7c);
              auVar9 = vmaxps_avx(auVar24,auVar27);
              auVar9 = vminps_avx(auVar9,auVar36);
              auVar9 = vsubps_avx(auVar9,auVar24);
              auVar24 = vmaxps_avx(auVar26,auVar31);
              auVar24 = vminps_avx(auVar24,auVar39);
              auVar26 = vsubps_avx(auVar24,auVar26);
              auVar24 = vmaxps_avx(auVar30,auVar34);
              auVar24 = vminps_avx(auVar24,auVar41);
              auVar24 = vsubps_avx(auVar24,auVar30);
              local_1048._0_4_ =
                   auVar9._0_4_ * auVar9._0_4_ + auVar26._0_4_ * auVar26._0_4_ +
                   auVar24._0_4_ * auVar24._0_4_;
              local_1048._4_4_ =
                   auVar9._4_4_ * auVar9._4_4_ + auVar26._4_4_ * auVar26._4_4_ +
                   auVar24._4_4_ * auVar24._4_4_;
              fStack_1040 = auVar9._8_4_ * auVar9._8_4_ + auVar26._8_4_ * auVar26._8_4_ +
                            auVar24._8_4_ * auVar24._8_4_;
              fStack_103c = auVar9._12_4_ * auVar9._12_4_ + auVar26._12_4_ * auVar26._12_4_ +
                            auVar24._12_4_ * auVar24._12_4_;
              auVar24 = vcmpps_avx(_local_1048,auVar47._0_16_,2);
              auVar26 = vcmpps_avx(auVar27,auVar36,2);
              auVar24 = vandps_avx(auVar24,auVar26);
              if (((uint)uVar21 & 7) == 6) {
LAB_012c36c0:
                auVar26 = vcmpps_avx(*(undefined1 (*) [16])((uVar21 & 0xfffffffffffffff0) + 0xe0),
                                     auVar23,2);
                auVar30 = vcmpps_avx(auVar23,*(undefined1 (*) [16])
                                              ((uVar21 & 0xfffffffffffffff0) + 0xf0),1);
                auVar26 = vandps_avx(auVar26,auVar30);
                auVar24 = vandps_avx(auVar26,auVar24);
                auVar24 = vpslld_avx(auVar24,0x1f);
                goto LAB_012c36e3;
              }
              uVar17 = vmovmskps_avx(auVar24);
              unaff_RBP = CONCAT44(uVar18,uVar17);
            }
          }
          else if ((uVar21 & 8) == 0) {
            uVar16 = uVar21 & 0xfffffffffffffff0;
            fVar5 = query->time;
            auVar23._4_4_ = fVar5;
            auVar23._0_4_ = fVar5;
            auVar23._8_4_ = fVar5;
            auVar23._12_4_ = fVar5;
            auVar32._0_4_ = fVar5 * *(float *)(uVar16 + 0x80) + *(float *)(uVar16 + 0x20);
            auVar32._4_4_ = fVar5 * *(float *)(uVar16 + 0x84) + *(float *)(uVar16 + 0x24);
            auVar32._8_4_ = fVar5 * *(float *)(uVar16 + 0x88) + *(float *)(uVar16 + 0x28);
            auVar32._12_4_ = fVar5 * *(float *)(uVar16 + 0x8c) + *(float *)(uVar16 + 0x2c);
            auVar35._0_4_ = fVar5 * *(float *)(uVar16 + 0xa0) + *(float *)(uVar16 + 0x40);
            auVar35._4_4_ = fVar5 * *(float *)(uVar16 + 0xa4) + *(float *)(uVar16 + 0x44);
            auVar35._8_4_ = fVar5 * *(float *)(uVar16 + 0xa8) + *(float *)(uVar16 + 0x48);
            auVar35._12_4_ = fVar5 * *(float *)(uVar16 + 0xac) + *(float *)(uVar16 + 0x4c);
            auVar28._0_4_ = fVar5 * *(float *)(uVar16 + 0xc0) + *(float *)(uVar16 + 0x60);
            auVar28._4_4_ = fVar5 * *(float *)(uVar16 + 0xc4) + *(float *)(uVar16 + 100);
            auVar28._8_4_ = fVar5 * *(float *)(uVar16 + 200) + *(float *)(uVar16 + 0x68);
            auVar28._12_4_ = fVar5 * *(float *)(uVar16 + 0xcc) + *(float *)(uVar16 + 0x6c);
            auVar37._0_4_ = fVar5 * *(float *)(uVar16 + 0x90) + *(float *)(uVar16 + 0x30);
            auVar37._4_4_ = fVar5 * *(float *)(uVar16 + 0x94) + *(float *)(uVar16 + 0x34);
            auVar37._8_4_ = fVar5 * *(float *)(uVar16 + 0x98) + *(float *)(uVar16 + 0x38);
            auVar37._12_4_ = fVar5 * *(float *)(uVar16 + 0x9c) + *(float *)(uVar16 + 0x3c);
            auVar40._0_4_ = fVar5 * *(float *)(uVar16 + 0xb0) + *(float *)(uVar16 + 0x50);
            auVar40._4_4_ = fVar5 * *(float *)(uVar16 + 0xb4) + *(float *)(uVar16 + 0x54);
            auVar40._8_4_ = fVar5 * *(float *)(uVar16 + 0xb8) + *(float *)(uVar16 + 0x58);
            auVar40._12_4_ = fVar5 * *(float *)(uVar16 + 0xbc) + *(float *)(uVar16 + 0x5c);
            auVar42._0_4_ = fVar5 * *(float *)(uVar16 + 0xd0) + *(float *)(uVar16 + 0x70);
            auVar42._4_4_ = fVar5 * *(float *)(uVar16 + 0xd4) + *(float *)(uVar16 + 0x74);
            auVar42._8_4_ = fVar5 * *(float *)(uVar16 + 0xd8) + *(float *)(uVar16 + 0x78);
            auVar42._12_4_ = fVar5 * *(float *)(uVar16 + 0xdc) + *(float *)(uVar16 + 0x7c);
            auVar9 = vmaxps_avx(auVar24,auVar32);
            auVar9 = vminps_avx(auVar9,auVar37);
            auVar9 = vsubps_avx(auVar9,auVar24);
            auVar24 = vmaxps_avx(auVar26,auVar35);
            auVar24 = vminps_avx(auVar24,auVar40);
            auVar26 = vsubps_avx(auVar24,auVar26);
            auVar24 = vmaxps_avx(auVar30,auVar28);
            auVar24 = vminps_avx(auVar24,auVar42);
            auVar24 = vsubps_avx(auVar24,auVar30);
            local_1048._4_4_ =
                 auVar24._4_4_ * auVar24._4_4_ +
                 auVar26._4_4_ * auVar26._4_4_ + auVar9._4_4_ * auVar9._4_4_;
            local_1048._0_4_ =
                 auVar24._0_4_ * auVar24._0_4_ +
                 auVar26._0_4_ * auVar26._0_4_ + auVar9._0_4_ * auVar9._0_4_;
            fStack_1040 = auVar24._8_4_ * auVar24._8_4_ +
                          auVar26._8_4_ * auVar26._8_4_ + auVar9._8_4_ * auVar9._8_4_;
            fStack_103c = auVar24._12_4_ * auVar24._12_4_ +
                          auVar26._12_4_ * auVar26._12_4_ + auVar9._12_4_ * auVar9._12_4_;
            auVar24 = vcmpps_avx(auVar32,auVar37,2);
            auVar26 = vcmpps_avx(auVar40,local_ff8,5);
            auVar24 = vandps_avx(auVar24,auVar26);
            auVar10._4_4_ = fStack_fe4;
            auVar10._0_4_ = local_fe8;
            auVar10._8_4_ = fStack_fe0;
            auVar10._12_4_ = fStack_fdc;
            auVar26 = vcmpps_avx(auVar32,auVar10,2);
            auVar9._4_4_ = fStack_1004;
            auVar9._0_4_ = local_1008;
            auVar9._8_4_ = fStack_1000;
            auVar9._12_4_ = fStack_ffc;
            auVar30 = vcmpps_avx(auVar35,auVar9,2);
            auVar26 = vandps_avx(auVar30,auVar26);
            auVar30 = vcmpps_avx(auVar42,local_1018,5);
            auVar24 = vandps_avx(auVar24,auVar30);
            auVar30 = vcmpps_avx(auVar37,local_fd8,5);
            auVar9 = vcmpps_avx(auVar28,local_1028,2);
            auVar30 = vandps_avx(auVar9,auVar30);
            auVar26 = vandps_avx(auVar26,auVar30);
            auVar24 = vandps_avx(auVar26,auVar24);
            if (((uint)uVar21 & 7) == 6) goto LAB_012c36c0;
            auVar24 = vpslld_avx(auVar24,0x1f);
LAB_012c36e3:
            uVar17 = vmovmskps_avx(auVar24);
            unaff_RBP = CONCAT44(uVar18,uVar17);
          }
          if ((uVar21 & 8) == 0) {
            if (unaff_RBP == 0) {
              iVar15 = 4;
            }
            else {
              uVar16 = uVar21 & 0xfffffffffffffff0;
              lVar22 = 0;
              if (unaff_RBP != 0) {
                for (; (unaff_RBP >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              iVar15 = 0;
              uVar21 = *(ulong *)(uVar16 + lVar22 * 8);
              uVar19 = unaff_RBP - 1 & unaff_RBP;
              if (uVar19 != 0) {
                uVar2 = *(uint *)(local_1048 + lVar22 * 4);
                lVar22 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar16 + lVar22 * 8);
                uVar3 = *(uint *)(local_1048 + lVar22 * 4);
                uVar19 = uVar19 - 1 & uVar19;
                if (uVar19 == 0) {
                  if (uVar2 < uVar3) {
                    *(ulong *)*local_1030 = uVar4;
                    *(uint *)(*local_1030 + 8) = uVar3;
                    local_1030 = local_1030 + 1;
                  }
                  else {
                    *(ulong *)*local_1030 = uVar21;
                    *(uint *)(*local_1030 + 8) = uVar2;
                    local_1030 = local_1030 + 1;
                    uVar21 = uVar4;
                  }
                }
                else {
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = uVar21;
                  auVar24 = vpunpcklqdq_avx(auVar25,ZEXT416(uVar2));
                  auVar29._8_8_ = 0;
                  auVar29._0_8_ = uVar4;
                  auVar26 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar3));
                  lVar22 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                    }
                  }
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = *(ulong *)(uVar16 + lVar22 * 8);
                  auVar9 = vpunpcklqdq_avx(auVar33,ZEXT416(*(uint *)(local_1048 + lVar22 * 4)));
                  auVar30 = vpcmpgtd_avx(auVar26,auVar24);
                  uVar19 = uVar19 - 1 & uVar19;
                  if (uVar19 == 0) {
                    auVar10 = vpshufd_avx(auVar30,0xaa);
                    auVar30 = vblendvps_avx(auVar26,auVar24,auVar10);
                    auVar24 = vblendvps_avx(auVar24,auVar26,auVar10);
                    auVar26 = vpcmpgtd_avx(auVar9,auVar30);
                    auVar10 = vpshufd_avx(auVar26,0xaa);
                    auVar26 = vblendvps_avx(auVar9,auVar30,auVar10);
                    auVar30 = vblendvps_avx(auVar30,auVar9,auVar10);
                    auVar9 = vpcmpgtd_avx(auVar30,auVar24);
                    auVar10 = vpshufd_avx(auVar9,0xaa);
                    auVar9 = vblendvps_avx(auVar30,auVar24,auVar10);
                    auVar24 = vblendvps_avx(auVar24,auVar30,auVar10);
                    *local_1030 = auVar24;
                    local_1030[1] = auVar9;
                    local_1030 = local_1030 + 2;
                    uVar21 = auVar26._0_8_;
                  }
                  else {
                    lVar22 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                      }
                    }
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = *(ulong *)(uVar16 + lVar22 * 8);
                    auVar23 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_1048 + lVar22 * 4)));
                    auVar10 = vpshufd_avx(auVar30,0xaa);
                    auVar30 = vblendvps_avx(auVar26,auVar24,auVar10);
                    auVar24 = vblendvps_avx(auVar24,auVar26,auVar10);
                    auVar26 = vpcmpgtd_avx(auVar23,auVar9);
                    auVar10 = vpshufd_avx(auVar26,0xaa);
                    auVar26 = vblendvps_avx(auVar23,auVar9,auVar10);
                    auVar9 = vblendvps_avx(auVar9,auVar23,auVar10);
                    auVar10 = vpcmpgtd_avx(auVar9,auVar24);
                    auVar23 = vpshufd_avx(auVar10,0xaa);
                    auVar10 = vblendvps_avx(auVar9,auVar24,auVar23);
                    auVar24 = vblendvps_avx(auVar24,auVar9,auVar23);
                    auVar9 = vpcmpgtd_avx(auVar26,auVar30);
                    auVar23 = vpshufd_avx(auVar9,0xaa);
                    auVar9 = vblendvps_avx(auVar26,auVar30,auVar23);
                    auVar26 = vblendvps_avx(auVar30,auVar26,auVar23);
                    auVar30 = vpcmpgtd_avx(auVar10,auVar26);
                    auVar23 = vpshufd_avx(auVar30,0xaa);
                    auVar30 = vblendvps_avx(auVar10,auVar26,auVar23);
                    auVar26 = vblendvps_avx(auVar26,auVar10,auVar23);
                    *local_1030 = auVar24;
                    local_1030[1] = auVar26;
                    local_1030[2] = auVar30;
                    local_1030 = local_1030 + 3;
                    uVar21 = auVar9._0_8_;
                    iVar15 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar15 = 6;
          }
        } while (iVar15 == 0);
      } while ((iVar15 != 6) || (lVar22 = (ulong)((uint)uVar21 & 0xf) - 8, lVar22 == 0));
      prim = (InstancePrimitive *)(uVar21 & 0xfffffffffffffff0);
      bVar12 = 0;
      do {
        bVar20 = bVar12;
        bVar13 = InstanceIntersector1MB::pointQuery(query,context,prim);
        prim = prim + 1;
        lVar22 = lVar22 + -1;
        bVar12 = bVar20 | bVar13;
      } while (lVar22 != 0);
      auVar43 = ZEXT1664(local_fa8);
      auVar44 = ZEXT1664(local_fb8);
      auVar45 = ZEXT1664(local_f88);
      auVar46 = ZEXT1664(local_fc8);
      auVar47 = ZEXT1664(local_f98);
    } while (bVar20 == 0 && !bVar13);
    uVar18 = *(undefined4 *)&(context->query_radius).field_0;
    auVar24._4_4_ = uVar18;
    auVar24._0_4_ = uVar18;
    auVar24._8_4_ = uVar18;
    auVar24._12_4_ = uVar18;
    uVar18 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar26._4_4_ = uVar18;
    auVar26._0_4_ = uVar18;
    auVar26._8_4_ = uVar18;
    auVar26._12_4_ = uVar18;
    uVar18 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar30._4_4_ = uVar18;
    auVar30._0_4_ = uVar18;
    auVar30._8_4_ = uVar18;
    auVar30._12_4_ = uVar18;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar45 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar1 = (context->query_radius).field_0;
      auVar9 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
      auVar45 = ZEXT1664(auVar9);
    }
    bVar14 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }